

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Node * __thiscall spoa::Graph::Node::Successor(Node *this,uint32_t label)

{
  pointer ppEVar1;
  Edge *pEVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  pointer ppEVar4;
  undefined1 local_24 [4];
  
  ppEVar4 = (this->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppEVar4 == ppEVar1) {
      return (Node *)0x0;
    }
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      (((*ppEVar4)->labels).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       ((*ppEVar4)->labels).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,local_24);
    pEVar2 = *ppEVar4;
    ppEVar4 = ppEVar4 + 1;
  } while (_Var3._M_current ==
           (pEVar2->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish);
  return pEVar2->head;
}

Assistant:

Graph::Node* Graph::Node::Successor(std::uint32_t label) const {
  for (const auto& it : outedges) {
    auto jt = std::find(it->labels.begin(), it->labels.end(), label);
    if (jt != it->labels.end()) {
      return it->head;
    }
  }
  return nullptr;
}